

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderQuadsDegenerateCase::initTest(TessellationShaderQuadsDegenerateCase *this)

{
  ostringstream *this_00;
  _tessellation_shader_vertex_spacing vertex_spacing;
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  NotSupportedError *this_02;
  TestError *this_03;
  long lVar6;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  long lVar7;
  value_type local_238;
  long local_1f8;
  _runs *local_1f0;
  long local_1e8;
  GLint tess_levels [3];
  GLint gl_max_tess_gen_level_value;
  string vs_mode_string;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&local_238);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_01,gl,&this->super_TestCaseBase);
  this->m_utils = this_01;
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x73);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x76);
  gl_max_tess_gen_level_value = 0;
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &gl_max_tess_gen_level_value);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x7c);
  tess_levels[0] = -gl_max_tess_gen_level_value / 2;
  tess_levels[1] = -1;
  tess_levels[2] = 1;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1f0 = &this->m_runs;
  bVar1 = false;
  lVar6 = 0;
  while (lVar6 != 3) {
    vertex_spacing = (&DAT_017b2344)[lVar6];
    local_1f8 = lVar6;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      iVar2 = tess_levels[lVar7];
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._0_4_ = 0;
      local_238._52_8_ = 0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish._0_4_ = 0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish._4_4_ = 0;
      iVar4 = iVar2;
      if (iVar2 < 0) {
        iVar4 = 1;
      }
      local_238.outer[3] = (float)iVar4;
      local_238.inner[1] = (float)iVar2;
      local_238.inner[0] = (float)iVar2;
      local_238.outer[2] = local_238.outer[3];
      local_238.vertex_spacing = vertex_spacing;
      uVar5 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,local_238.inner,
                         local_238.outer,vertex_spacing,false);
      local_238.n_vertices = uVar5;
      if (uVar5 == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                   vertex_spacing_00);
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "No vertices were generated by tessellator for: inner tess levels:[");
        std::ostream::operator<<(this_00,local_238.inner[0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,local_238.inner[1]);
        std::operator<<((ostream *)this_00,"], outer tess levels:[");
        std::ostream::operator<<(this_00,local_238.outer[0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,local_238.outer[1]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,local_238.outer[2]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,local_238.outer[3]);
        std::operator<<((ostream *)this_00,"], primitive mode: quads, vertex spacing: ");
        std::operator<<((ostream *)this_00,(string *)&vs_mode_string);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::__cxx11::string::~string((string *)&vs_mode_string);
        bVar1 = true;
      }
      else {
        local_1e8 = lVar7;
        TessellationShaderUtils::getDataGeneratedByTessellator
                  ((vector<char,_std::allocator<char>_> *)local_1b0,this->m_utils,local_238.inner,
                   false,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
                   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,local_238.vertex_spacing,local_238.outer)
        ;
        std::vector<char,_std::allocator<char>_>::_M_move_assign
                  (&local_238.data,(_Vector_base<char,_std::allocator<char>_> *)local_1b0);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)local_1b0);
        lVar7 = local_1e8;
      }
      std::
      vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
      ::push_back(local_1f0,&local_238);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&local_238.data.super__Vector_base<char,_std::allocator<char>_>);
    }
    lVar6 = local_1f8 + 1;
  }
  if (!bVar1) {
    return;
  }
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_03,
             "Zero vertices were generated by tessellator for at least one run which is not a correct behavior"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
             ,0xce);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderQuadsDegenerateCase::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	const glw::GLint   tess_levels[] = { -gl_max_tess_gen_level_value / 2, -1, 1 };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	const _tessellation_shader_vertex_spacing vs_modes[] = {
		/* NOTE: We do not check "fractional even" vertex spacing since it will always
		 *       clamp to 2 which is out of scope for this test.
		 */
		TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT,
		TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
	};
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	/* Iterate through all vertex spacing modes */
	bool has_failed = false;

	for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
	{
		_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

		/* Iterate through all values that should be used for irrelevant tessellation levels */
		for (unsigned int n_tess_level = 0; n_tess_level < n_tess_levels; ++n_tess_level)
		{
			const glw::GLint tess_level = tess_levels[n_tess_level];

			/* Set up the run descriptor.
			 *
			 * Round outer tesellation levels to 1 if necessary, since otherwise no geometry will
			 * be generated.
			 **/
			_run run;

			run.inner[0]	   = (float)tess_level;
			run.inner[1]	   = (float)tess_level;
			run.outer[0]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[1]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[2]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[3]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.vertex_spacing = vs_mode;

			/* Retrieve vertex data for both passes */
			run.n_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, run.inner, run.outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */

			if (run.n_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.inner[0] << ", " << run.inner[1] << "]"
																			  ", outer tess levels:"
																			  "["
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << "]"
													  ", primitive mode: quads, "
													  "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				has_failed = true;
			}
			else
			{
				/* Retrieve the data buffers */
				run.data = m_utils->getDataGeneratedByTessellator(run.inner, false, /* is_point_mode_enabled */
																  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
																  TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																  run.vertex_spacing, run.outer);
			}

			/* Store the run data */
			m_runs.push_back(run);
		} /* for (all tessellation levels) */
	}	 /* for (all vertex spacing modes) */

	if (has_failed)
	{
		TCU_FAIL("Zero vertices were generated by tessellator for at least one run which is not "
				 "a correct behavior");
	}
}